

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGeneratorMocUic::ParallelMocAutoRegister
          (string *__return_storage_ptr__,cmQtAutoGeneratorMocUic *this,string *baseName)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar1;
  char cVar2;
  int iVar3;
  iterator iVar4;
  uint uVar5;
  ulong uVar6;
  uint __val;
  _Rb_tree_header *p_Var7;
  string __str;
  long *local_58;
  uint local_50;
  long local_48 [2];
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->JobsMutex_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_38 = baseName;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &this->MocAutoFiles_;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,__return_storage_ptr__);
  p_Var7 = &(this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var7) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,__return_storage_ptr__);
  }
  else {
    __val = 2;
    do {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      cVar2 = '\x01';
      if (9 < __val) {
        uVar6 = (ulong)__val;
        cVar1 = '\x04';
        do {
          cVar2 = cVar1;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            cVar2 = cVar2 + -2;
            goto LAB_0019c26e;
          }
          if (uVar5 < 1000) {
            cVar2 = cVar2 + -1;
            goto LAB_0019c26e;
          }
          if (uVar5 < 10000) goto LAB_0019c26e;
          uVar6 = uVar6 / 10000;
          cVar1 = cVar2 + '\x04';
        } while (99999 < uVar5);
        cVar2 = cVar2 + '\x01';
      }
LAB_0019c26e:
      local_58 = local_48;
      std::__cxx11::string::_M_construct((ulong)&local_58,cVar2);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58,local_50,__val);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this_00->_M_t,__return_storage_ptr__);
      if ((_Rb_tree_header *)iVar4._M_node == p_Var7) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,__return_storage_ptr__);
        break;
      }
      __val = __val + 1;
    } while (__val != 0x400);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->JobsMutex_);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::ParallelMocAutoRegister(
  std::string const& baseName)
{
  std::string res;
  {
    std::lock_guard<std::mutex> mocLock(JobsMutex_);
    res = baseName;
    res += ".cpp";
    if (MocAutoFiles_.find(res) == MocAutoFiles_.end()) {
      MocAutoFiles_.emplace(res);
    } else {
      // Append number suffix to the file name
      for (unsigned int ii = 2; ii != 1024; ++ii) {
        res = baseName;
        res += '_';
        res += std::to_string(ii);
        res += ".cpp";
        if (MocAutoFiles_.find(res) == MocAutoFiles_.end()) {
          MocAutoFiles_.emplace(res);
          break;
        }
      }
    }
  }
  return res;
}